

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O1

void __thiscall
duckdb::ChimpScanState<float>::Skip
          (ChimpScanState<float> *this,ColumnSegment *segment,idx_t skip_count)

{
  ulong group_size;
  INTERNAL_TYPE buffer [1024];
  uint auStack_1028 [1026];
  
  if (skip_count != 0) {
    do {
      group_size = 0x400 - (ulong)((uint)this->total_value_count & 0x3ff);
      if (skip_count < group_size) {
        group_size = skip_count;
      }
      ScanGroup<unsigned_int>(this,auStack_1028,group_size);
      skip_count = skip_count - group_size;
    } while (skip_count != 0);
  }
  return;
}

Assistant:

void Skip(ColumnSegment &segment, idx_t skip_count) {
		using INTERNAL_TYPE = typename ChimpType<T>::TYPE;
		INTERNAL_TYPE buffer[ChimpPrimitives::CHIMP_SEQUENCE_SIZE];

		while (skip_count) {
			auto skip_size = MinValue(skip_count, LeftInGroup());
			ScanGroup<CHIMP_TYPE>(buffer, skip_size);
			skip_count -= skip_size;
		}
	}